

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.cc
# Opt level: O0

Surface * __thiscall SDL2pp::Surface::SetClipRect(Surface *this,Optional<Rect> *rect)

{
  SDL_Surface *pSVar1;
  bool bVar2;
  int iVar3;
  Exception *this_00;
  value_type *local_40;
  Optional<Rect> *rect_local;
  Surface *this_local;
  
  pSVar1 = this->surface_;
  bVar2 = sdl2pp_libcpp_optional::optional::operator_cast_to_bool((optional *)rect);
  if (bVar2) {
    local_40 = sdl2pp_libcpp_optional::optional<SDL2pp::Rect>::operator*(rect);
  }
  else {
    local_40 = (value_type *)0x0;
  }
  iVar3 = SDL_SetClipRect(pSVar1,local_40);
  if (iVar3 != 1) {
    this_00 = (Exception *)__cxa_allocate_exception(0x50);
    Exception::Exception(this_00,"SDL_SetClipRect");
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  return this;
}

Assistant:

Surface& Surface::SetClipRect(const Optional<Rect>& rect) {
	if (SDL_SetClipRect(surface_, rect ? &*rect : nullptr) != SDL_TRUE)
		throw Exception("SDL_SetClipRect");
	return *this;
}